

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O2

duk_int_t __thiscall DukValue::as_int(DukValue *this)

{
  DukException *this_00;
  DukException *pDVar1;
  char *rhs;
  undefined **local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (this->mType == NUMBER) {
    return (int)(this->mPOD).number;
  }
  this_00 = (DukException *)__cxa_allocate_exception(0x28);
  local_40._M_p = (pointer)&local_30;
  local_30._M_allocated_capacity = 0;
  local_30._8_8_ = 0;
  local_48 = &PTR__DukException_00167710;
  local_38 = 0;
  pDVar1 = DukException::operator<<((DukException *)&local_48,"Expected number, got ");
  rhs = type_name(this);
  pDVar1 = DukException::operator<<(pDVar1,rhs);
  DukException::DukException(this_00,pDVar1);
  __cxa_throw(this_00,&DukException::typeinfo,DukException::~DukException);
}

Assistant:

inline duk_int_t as_int() const {
		if (mType != NUMBER)
			throw DukException() << "Expected number, got " << type_name();
		return static_cast<int32_t>(mPOD.number);
	}